

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O1

char * __thiscall sqvector<char>::push_back(sqvector<char> *this,char *val)

{
  SQUnsignedInteger SVar1;
  char *pcVar2;
  SQUnsignedInteger size;
  
  if (this->_allocated <= this->_size) {
    SVar1 = this->_size * 2;
    size = 4;
    if (SVar1 != 0) {
      size = SVar1;
    }
    pcVar2 = (char *)sq_vm_realloc(this->_vals,this->_allocated,size);
    this->_vals = pcVar2;
    this->_allocated = size;
  }
  pcVar2 = this->_vals;
  SVar1 = this->_size;
  this->_size = SVar1 + 1;
  pcVar2[SVar1] = *val;
  return pcVar2 + SVar1;
}

Assistant:

inline T &push_back(const T& val = T())
    {
        if(_allocated <= _size)
            _realloc(_size * 2);
        return *(new ((void *)&_vals[_size++]) T(val));
    }